

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t vbmi2_despace(char *bytes,size_t howmany)

{
  undefined8 uVar1;
  ulong in_RSI;
  long in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  char c;
  __mmask64 notwhite;
  __m512i x;
  size_t i;
  __m512i spaces;
  size_t pos;
  undefined8 local_1c8;
  undefined8 local_158;
  
  local_158 = 0;
  auVar2 = vpbroadcastb_avx512bw(ZEXT116(0x20));
  auVar2 = vmovdqa64_avx512f(auVar2);
  auVar2 = vmovdqa64_avx512f(auVar2);
  auVar2 = vmovdqa64_avx512f(auVar2);
  for (local_1c8 = 0; local_1c8 + 0x3f < in_RSI; local_1c8 = local_1c8 + 0x40) {
    auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_1c8));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar2);
    uVar1 = vpcmpgtb_avx512bw(auVar4,auVar5);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpcompressb_avx512_vbmi2(auVar3,uVar1);
    *(undefined1 (*) [64])(in_RDI + local_158) = auVar3;
    local_158 = (long)(int)POPCOUNT(uVar1) + local_158;
  }
  for (; local_1c8 < in_RSI; local_1c8 = local_1c8 + 1) {
    if (' ' < *(char *)(in_RDI + local_1c8)) {
      *(char *)(in_RDI + local_158) = *(char *)(in_RDI + local_1c8);
      local_158 = local_158 + 1;
    }
  }
  return local_158;
}

Assistant:

size_t vbmi2_despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m512i spaces = _mm512_set1_epi8(' ');
  size_t i = 0;
  for (; i + 63 < howmany; i += 64) {
    __m512i x = _mm512_loadu_si512((const __m512i *)(bytes + i));
    __mmask64  notwhite = _mm512_cmpgt_epi8_mask  (x, spaces);
    _mm512_mask_compressstoreu_epi8  (bytes + pos, notwhite, x);
    pos += _popcnt64(notwhite);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c <= ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}